

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ptr<Expression> __thiscall Parser::value(Parser *this)

{
  code *pcVar1;
  initializer_list<TokenType> __l;
  bool bVar2;
  longlong lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  Parser *in_RSI;
  double dVar5;
  ptr<Expression> pVar6;
  undefined1 local_208 [32];
  Token local_1e8;
  undefined1 local_1b0 [80];
  undefined1 local_160 [24];
  shared_ptr<PrimitiveExpression<Double>_> local_148;
  shared_ptr<PrimitiveExpression<Integer>_> local_138;
  Token local_128;
  double local_f0;
  double doubleValue;
  string local_e0;
  longlong local_b0;
  longlong integerValue;
  Token local_98;
  undefined1 local_5d;
  bool logicalValue;
  allocator<TokenType> local_49;
  TokenType local_48 [2];
  iterator local_40;
  size_type local_38;
  vector<TokenType,_std::allocator<TokenType>_> local_30;
  Parser *this_local;
  ptr<Expression> *expr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  local_48[0] = True;
  local_48[1] = 0x3c;
  local_40 = local_48;
  local_38 = 2;
  this_local = this;
  std::allocator<TokenType>::allocator(&local_49);
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<TokenType,_std::allocator<TokenType>_>::vector(&local_30,__l,&local_49);
  bVar2 = matchAny(in_RSI,&local_30);
  std::vector<TokenType,_std::allocator<TokenType>_>::~vector(&local_30);
  std::allocator<TokenType>::~allocator(&local_49);
  if (bVar2) {
    token(&local_98,in_RSI);
    Token::~Token(&local_98);
    local_5d = local_98.type == True;
    consume(in_RSI);
    make<PrimitiveExpression<Boolean>,bool&>((bool *)&integerValue);
    std::shared_ptr<Expression>::shared_ptr<PrimitiveExpression<Boolean>,void>
              ((shared_ptr<Expression> *)this,
               (shared_ptr<PrimitiveExpression<Boolean>_> *)&integerValue);
    std::shared_ptr<PrimitiveExpression<Boolean>_>::~shared_ptr
              ((shared_ptr<PrimitiveExpression<Boolean>_> *)&integerValue);
    _Var4._M_pi = extraout_RDX;
  }
  else {
    bVar2 = match(in_RSI,Number);
    if (bVar2) {
      token((Token *)&doubleValue,in_RSI);
      lVar3 = std::__cxx11::stoll(&local_e0,(size_t *)0x0,10);
      Token::~Token((Token *)&doubleValue);
      local_b0 = lVar3;
      token(&local_128,in_RSI);
      dVar5 = std::__cxx11::stod(&local_128.lexeme,(size_t *)0x0);
      Token::~Token(&local_128);
      local_f0 = dVar5;
      consume(in_RSI);
      if (((double)local_b0 != local_f0) || (NAN((double)local_b0) || NAN(local_f0))) {
        make<PrimitiveExpression<Double>,double&>((double *)(local_160 + 0x18));
        std::shared_ptr<Expression>::shared_ptr<PrimitiveExpression<Double>,void>
                  ((shared_ptr<Expression> *)this,
                   (shared_ptr<PrimitiveExpression<Double>_> *)(local_160 + 0x18));
        std::shared_ptr<PrimitiveExpression<Double>_>::~shared_ptr
                  ((shared_ptr<PrimitiveExpression<Double>_> *)(local_160 + 0x18));
        _Var4._M_pi = extraout_RDX_01;
      }
      else {
        make<PrimitiveExpression<Integer>,long_long&>((longlong *)&local_138);
        std::shared_ptr<Expression>::shared_ptr<PrimitiveExpression<Integer>,void>
                  ((shared_ptr<Expression> *)this,&local_138);
        std::shared_ptr<PrimitiveExpression<Integer>_>::~shared_ptr(&local_138);
        _Var4._M_pi = extraout_RDX_00;
      }
    }
    else {
      bVar2 = match(in_RSI,SingleQuote);
      if (bVar2) {
        consume(in_RSI);
        local_160[0x17] = '\0';
        token((Token *)(local_1b0 + 0x18),in_RSI);
        make<PrimitiveExpression<String>,std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160);
        std::shared_ptr<Expression>::shared_ptr<PrimitiveExpression<String>,void>
                  ((shared_ptr<Expression> *)this,
                   (shared_ptr<PrimitiveExpression<String>_> *)local_160);
        std::shared_ptr<PrimitiveExpression<String>_>::~shared_ptr
                  ((shared_ptr<PrimitiveExpression<String>_> *)local_160);
        Token::~Token((Token *)(local_1b0 + 0x18));
        consume(in_RSI,String,"string");
        consume(in_RSI,SingleQuote,"\"\'\"");
        _Var4._M_pi = extraout_RDX_02;
      }
      else {
        bVar2 = match(in_RSI,DoubleQuote);
        if (bVar2) {
          consume(in_RSI);
          local_1b0[0x17] = '\0';
          token(&local_1e8,in_RSI);
          make<PrimitiveExpression<String>,std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0)
          ;
          std::shared_ptr<Expression>::shared_ptr<PrimitiveExpression<String>,void>
                    ((shared_ptr<Expression> *)this,
                     (shared_ptr<PrimitiveExpression<String>_> *)local_1b0);
          std::shared_ptr<PrimitiveExpression<String>_>::~shared_ptr
                    ((shared_ptr<PrimitiveExpression<String>_> *)local_1b0);
          Token::~Token(&local_1e8);
          consume(in_RSI,String,"string");
          consume(in_RSI,DoubleQuote,"\'\"\'");
          _Var4._M_pi = extraout_RDX_03;
        }
        else {
          bVar2 = match(in_RSI,LeftCurly);
          if (bVar2) {
            object((Parser *)(local_208 + 0x10));
            std::shared_ptr<Expression>::shared_ptr<ObjectExpression,void>
                      ((shared_ptr<Expression> *)this,
                       (shared_ptr<ObjectExpression> *)(local_208 + 0x10));
            std::shared_ptr<ObjectExpression>::~shared_ptr
                      ((shared_ptr<ObjectExpression> *)(local_208 + 0x10));
            _Var4._M_pi = extraout_RDX_04;
          }
          else {
            bVar2 = match(in_RSI,LeftBrack);
            if (bVar2) {
              array((Parser *)local_208);
              std::shared_ptr<Expression>::shared_ptr<ArrayExpression,void>
                        ((shared_ptr<Expression> *)this,(shared_ptr<ArrayExpression> *)local_208);
              std::shared_ptr<ArrayExpression>::~shared_ptr
                        ((shared_ptr<ArrayExpression> *)local_208);
              _Var4._M_pi = extraout_RDX_05;
            }
            else {
              bVar2 = match(in_RSI,Lambda);
              if (!bVar2) {
                unexpected(in_RSI);
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              pVar6 = lambda(this);
              _Var4 = pVar6.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi;
            }
          }
        }
      }
    }
  }
  pVar6.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  pVar6.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar6.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::value() {
    if(matchAny({ TokenType::True, TokenType::False })) {
        bool logicalValue = token().type == TokenType::True;
        consume();
        return make<PrimitiveExpression<Boolean>>(logicalValue);

    } else if(match(TokenType::Number)) {
        long long int integerValue = std::stoll(token().lexeme);
        double doubleValue = std::stod(token().lexeme);
        consume();

        if(integerValue == doubleValue) {
            return make<PrimitiveExpression<Integer>>(integerValue);
        }

        return make<PrimitiveExpression<Double>>(doubleValue);

    } else if(match(TokenType::SingleQuote)) {
        consume();
        ptr<Expression> expr = make<PrimitiveExpression<String>>(token().lexeme);
        consume(TokenType::String, "string");
        consume(TokenType::SingleQuote, "\"'\"");
        return expr;

    } else if(match(TokenType::DoubleQuote)) {
        consume();
        ptr<Expression> expr = make<PrimitiveExpression<String>>(token().lexeme);
        consume(TokenType::String, "string");
        consume(TokenType::DoubleQuote, "'\"'");
        return expr;

    } else if(match(TokenType::LeftCurly)) {
        return object();
    } else if(match(TokenType::LeftBrack)) {
        return array();
    } else if(match(TokenType::Lambda)) {
        return lambda();
    } else {
        unexpected();
    }
}